

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

void path_process(char *buf,size_t len,size_t *cur_len,char *path)

{
  __uid_t __uid;
  passwd *ppVar1;
  passwd *local_d8;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  char user [128];
  passwd *pw;
  char *username;
  char *s;
  char *path_local;
  size_t *cur_len_local;
  size_t len_local;
  char *buf_local;
  
  if (*path == '~') {
    pw = (passwd *)(path + 1);
    ppVar1 = (passwd *)strstr((char *)pw,"/");
    if (ppVar1 != (passwd *)0x0) {
      if ((passwd *)(path + 0x81) <= ppVar1) {
        return;
      }
      local_cc = 0;
      for (; pw < ppVar1; pw = (passwd *)((long)&pw->pw_name + 1)) {
        local_c8[local_cc] = *(undefined1 *)&pw->pw_name;
        local_cc = local_cc + 1;
      }
      local_c8[local_cc] = 0;
      pw = (passwd *)local_c8;
    }
    if (*(char *)&pw->pw_name == '\0') {
      __uid = getuid();
      local_d8 = getpwuid(__uid);
    }
    else {
      local_d8 = getpwnam((char *)pw);
    }
    if ((local_d8 != (passwd *)0x0) &&
       (strnfcat(buf,len,cur_len,"%s%s",local_d8->pw_dir,"/"), ppVar1 != (passwd *)0x0)) {
      strnfcat(buf,len,cur_len,"%s",ppVar1);
    }
  }
  else {
    strnfcat(buf,len,cur_len,"%s",path);
  }
  return;
}

Assistant:

static void path_process(char *buf, size_t len, size_t *cur_len,
						 const char *path)
{
#if defined(UNIX)

	/* Home directory on Unixes */
	if (path[0] == '~') {
		const char *s;
		const char *username = path + 1;

		struct passwd *pw;
		char user[128];

		/* Look for non-user portion of the file */
		s = strstr(username, PATH_SEP);
		if (s) {
			int i;

			/* Keep username a decent length */
			if (s >= username + sizeof(user)) return;

			for (i = 0; username < s; ++i) user[i] = *username++;
			user[i] = '\0';
			username = user;
		}

		/* Look up a user (or "current" user) */
		pw = username[0] ? getpwnam(username) : getpwuid(getuid());
		if (!pw) return;

		/* Copy across */
		strnfcat(buf, len, cur_len, "%s%s", pw->pw_dir, PATH_SEP);
		if (s) strnfcat(buf, len, cur_len, "%s", s);
	} else

#endif /* defined(UNIX) */

		strnfcat(buf, len, cur_len, "%s", path);
}